

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

err_t EBML_MasterAppend(ebml_master *Element,ebml_element *Append)

{
  bool_t bVar1;
  err_t eVar2;
  
  bVar1 = Node_IsPartOf(Element,0x544d4245);
  if (bVar1 == 0) {
    __assert_fail("Node_IsPartOf(Element,EBML_MASTER_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x57,"err_t EBML_MasterAppend(ebml_master *, ebml_element *)");
  }
  if (Append != (ebml_element *)0x0) {
    eVar2 = (**(code **)((long)(Append->Base).Base.VMT + 0x48))(Append,Element,0);
    if (eVar2 == 0) {
      (Element->Base).bValueIsSet = '\x01';
      (Element->Base).bNeedDataSizeUpdate = '\x01';
    }
    return eVar2;
  }
  __assert_fail("(const void*)(Append)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x58,"err_t EBML_MasterAppend(ebml_master *, ebml_element *)");
}

Assistant:

err_t EBML_MasterAppend(ebml_master *Element, ebml_element *Append)
{
    err_t Result;
	assert(Node_IsPartOf(Element,EBML_MASTER_CLASS));
    Result = NodeTree_SetParent(Append,Element,NULL);
    if (Result==ERR_NONE)
    {
        Element->Base.bNeedDataSizeUpdate = 1;
        Element->Base.bValueIsSet = 1;
    }
    return Result;
}